

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

char * get_METAL_varname_in_buf(Context *ctx,RegisterType rt,int regnum,char *buf,size_t len)

{
  char *pcVar1;
  char *regtype_str;
  char regnum_str [16];
  size_t len_local;
  char *buf_local;
  int regnum_local;
  RegisterType rt_local;
  Context *ctx_local;
  
  regnum_str._8_8_ = len;
  pcVar1 = get_METAL_register_string(ctx,rt,regnum,(char *)&regtype_str,0x10);
  snprintf(buf,regnum_str._8_8_,"%s%s",pcVar1,&regtype_str);
  return buf;
}

Assistant:

static const char *get_METAL_varname_in_buf(Context *ctx, RegisterType rt,
                                           int regnum, char *buf,
                                           const size_t len)
{
    char regnum_str[16];
    const char *regtype_str = get_METAL_register_string(ctx, rt, regnum,
                                              regnum_str, sizeof (regnum_str));

    // We don't separate vars with vs_ or ps_ here, because, for the most part,
    //  there are only local vars in Metal shaders.
    snprintf(buf, len, "%s%s", regtype_str, regnum_str);
    return buf;
}